

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O1

void __thiscall re2::ExhaustiveTester::HandleRegexp(ExhaustiveTester *this,string *const_regexp)

{
  StringGenerator *this_00;
  pointer pcVar1;
  bool bVar2;
  StringPiece *text;
  int iVar3;
  string regexp;
  Tester tester;
  char *local_78;
  int local_70;
  char local_68 [16];
  string local_58;
  StringPiece local_38;
  
  this->regexps_ = this->regexps_ + 1;
  pcVar1 = (const_regexp->_M_dataplus)._M_p;
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + const_regexp->_M_string_length);
  if ((this->topwrapper_)._M_string_length != 0) {
    StringPrintf_abi_cxx11_(&local_58,(this->topwrapper_)._M_dataplus._M_p,local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p) !=
        &local_58.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_58._M_dataplus._M_p._1_7_,(char)local_58._M_dataplus._M_p));
    }
  }
  if (FLAGS_show_regexps == '\x01') {
    printf("\r%s",local_78);
    fflush(_stdout);
  }
  local_38.ptr_ = local_78;
  local_38.length_ = local_70;
  Tester::Tester((Tester *)&local_58,&local_38);
  if ((char)local_58._M_dataplus._M_p == '\0') {
    this_00 = &this->strgen_;
    StringGenerator::Reset(this_00);
    StringGenerator::GenerateNULL(this_00);
    if (this->randomstrings_ == true) {
      StringGenerator::Random(this_00,this->stringseed_,this->stringcount_);
    }
    if ((this->strgen_).hasnext_ == true) {
      iVar3 = 0;
      do {
        this->tests_ = this->tests_ + 1;
        text = StringGenerator::Next(this_00);
        bVar2 = Tester::TestInput((Tester *)&local_58,text);
        if (!bVar2) {
          this->failures_ = this->failures_ + 1;
          iVar3 = iVar3 + 1;
          if (FLAGS_max_bad_regexp_inputs <= iVar3) break;
        }
      } while ((this->strgen_).hasnext_ != false);
    }
  }
  Tester::~Tester((Tester *)&local_58);
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void ExhaustiveTester::HandleRegexp(const string& const_regexp) {
  regexps_++;
  string regexp = const_regexp;
  if (!topwrapper_.empty())
    regexp = StringPrintf(topwrapper_.c_str(), regexp.c_str());

  if (FLAGS_show_regexps) {
    printf("\r%s", regexp.c_str());
    fflush(stdout);
  }

  if (LOGGING) {
    // Write out test cases and answers for use in testing
    // other implementations, such as Go's regexp package.
    if (randomstrings_)
      LOG(ERROR) << "Cannot log with random strings.";
    if (regexps_ == 1) {  // first
      printf("strings\n");
      strgen_.Reset();
      while (strgen_.HasNext())
        printf("%s\n", escape(strgen_.Next()));
      printf("regexps\n");
    }
    printf("%s\n", escape(regexp));

    RE2 re(regexp);
    RE2::Options longest;
    longest.set_longest_match(true);
    RE2 relongest(regexp, longest);
    int ngroup = re.NumberOfCapturingGroups()+1;
    StringPiece* group = new StringPiece[ngroup];

    strgen_.Reset();
    while (strgen_.HasNext()) {
      StringPiece input = strgen_.Next();
      PrintResult(re, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(re, input, RE2::UNANCHORED, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::UNANCHORED, group, ngroup);
      printf("\n");
    }
    delete[] group;
    return;
  }

  Tester tester(regexp);
  if (tester.error())
    return;

  strgen_.Reset();
  strgen_.GenerateNULL();
  if (randomstrings_)
    strgen_.Random(stringseed_, stringcount_);
  int bad_inputs = 0;
  while (strgen_.HasNext()) {
    tests_++;
    if (!tester.TestInput(strgen_.Next())) {
      failures_++;
      if (++bad_inputs >= FLAGS_max_bad_regexp_inputs)
        break;
    }
  }
}